

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void transform(uint32_t *state,uint32_t *data)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint32_t uVar5;
  int iVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint uVar9;
  uint uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint uVar13;
  uint uVar14;
  uint32_t uVar15;
  uint uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint local_7c;
  uint uStack_78;
  uint j;
  uint32_t T [8];
  uint32_t W [16];
  uint32_t *data_local;
  uint32_t *state_local;
  
  uVar1 = *(undefined8 *)state;
  uVar2 = *(undefined8 *)(state + 2);
  uVar3 = *(undefined8 *)(state + 4);
  uVar4 = *(undefined8 *)(state + 6);
  T[2] = (uint32_t)uVar3;
  uVar5 = rotr_32(T[2],0xe);
  uVar5 = rotr_32(T[2] ^ uVar5,5);
  uVar5 = rotr_32(T[2] ^ uVar5,6);
  T[4] = (uint32_t)uVar4;
  T[3] = (uint32_t)((ulong)uVar3 >> 0x20);
  T[6] = __bswap_32(*data);
  T[5] = (uint32_t)((ulong)uVar4 >> 0x20);
  iVar6 = uVar5 + (T[4] ^ T[2] & (T[3] ^ T[4])) + 0x428a2f98 + T[6] + T[5];
  T[1] = (uint32_t)((ulong)uVar2 >> 0x20);
  uVar5 = iVar6 + T[1];
  T[0] = (uint32_t)uVar2;
  uStack_78 = (uint)uVar1;
  uVar7 = rotr_32(uStack_78,9);
  uVar7 = rotr_32(uStack_78 ^ uVar7,0xb);
  uVar7 = rotr_32(uStack_78 ^ uVar7,2);
  j = (uint)((ulong)uVar1 >> 0x20);
  uVar8 = uVar7 + (uStack_78 & (j ^ T[0])) + (j & T[0]) + iVar6;
  uVar7 = rotr_32(uVar5,0xe);
  uVar7 = rotr_32(uVar5 ^ uVar7,5);
  uVar7 = rotr_32(uVar5 ^ uVar7,6);
  T[7] = __bswap_32(data[1]);
  iVar6 = uVar7 + (T[3] ^ uVar5 & (T[2] ^ T[3])) + 0x71374491 + T[7] + T[4];
  uVar9 = iVar6 + T[0];
  uVar7 = rotr_32(uVar8,9);
  uVar7 = rotr_32(uVar8 ^ uVar7,0xb);
  uVar7 = rotr_32(uVar8 ^ uVar7,2);
  uVar10 = uVar7 + (uVar8 & (uStack_78 ^ j)) + (uStack_78 & j) + iVar6;
  uVar7 = rotr_32(uVar9,0xe);
  uVar7 = rotr_32(uVar9 ^ uVar7,5);
  uVar7 = rotr_32(uVar9 ^ uVar7,6);
  W[0] = __bswap_32(data[2]);
  iVar6 = uVar7 + (T[2] ^ uVar9 & (uVar5 ^ T[2])) + 0xb5c0fbcf + W[0] + T[3];
  uVar7 = iVar6 + j;
  uVar11 = rotr_32(uVar10,9);
  uVar11 = rotr_32(uVar10 ^ uVar11,0xb);
  uVar11 = rotr_32(uVar10 ^ uVar11,2);
  uVar12 = uVar11 + (uVar10 & (uVar8 ^ uStack_78)) + (uVar8 & uStack_78) + iVar6;
  uVar11 = rotr_32(uVar7,0xe);
  uVar11 = rotr_32(uVar7 ^ uVar11,5);
  uVar11 = rotr_32(uVar7 ^ uVar11,6);
  W[1] = __bswap_32(data[3]);
  iVar6 = uVar11 + (uVar5 ^ uVar7 & (uVar9 ^ uVar5)) + 0xe9b5dba5 + W[1] + T[2];
  uVar13 = iVar6 + uStack_78;
  uVar11 = rotr_32(uVar12,9);
  uVar11 = rotr_32(uVar12 ^ uVar11,0xb);
  uVar11 = rotr_32(uVar12 ^ uVar11,2);
  uVar14 = uVar11 + (uVar12 & (uVar10 ^ uVar8)) + (uVar10 & uVar8) + iVar6;
  uVar11 = rotr_32(uVar13,0xe);
  uVar11 = rotr_32(uVar13 ^ uVar11,5);
  uVar11 = rotr_32(uVar13 ^ uVar11,6);
  W[2] = __bswap_32(data[4]);
  iVar6 = uVar11 + (uVar9 ^ uVar13 & (uVar7 ^ uVar9)) + 0x3956c25b + W[2] + uVar5;
  uVar8 = iVar6 + uVar8;
  uVar5 = rotr_32(uVar14,9);
  uVar5 = rotr_32(uVar14 ^ uVar5,0xb);
  uVar5 = rotr_32(uVar14 ^ uVar5,2);
  uVar11 = uVar5 + (uVar14 & (uVar12 ^ uVar10)) + (uVar12 & uVar10) + iVar6;
  uVar5 = rotr_32(uVar8,0xe);
  uVar5 = rotr_32(uVar8 ^ uVar5,5);
  uVar5 = rotr_32(uVar8 ^ uVar5,6);
  W[3] = __bswap_32(data[5]);
  iVar6 = uVar5 + (uVar7 ^ uVar8 & (uVar13 ^ uVar7)) + 0x59f111f1 + W[3] + uVar9;
  uVar10 = iVar6 + uVar10;
  uVar5 = rotr_32(uVar11,9);
  uVar5 = rotr_32(uVar11 ^ uVar5,0xb);
  uVar5 = rotr_32(uVar11 ^ uVar5,2);
  uVar9 = uVar5 + (uVar11 & (uVar14 ^ uVar12)) + (uVar14 & uVar12) + iVar6;
  uVar5 = rotr_32(uVar10,0xe);
  uVar5 = rotr_32(uVar10 ^ uVar5,5);
  uVar5 = rotr_32(uVar10 ^ uVar5,6);
  W[4] = __bswap_32(data[6]);
  iVar6 = uVar5 + (uVar13 ^ uVar10 & (uVar8 ^ uVar13)) + 0x923f82a4 + W[4] + uVar7;
  uVar12 = iVar6 + uVar12;
  uVar5 = rotr_32(uVar9,9);
  uVar5 = rotr_32(uVar9 ^ uVar5,0xb);
  uVar5 = rotr_32(uVar9 ^ uVar5,2);
  uVar15 = uVar5 + (uVar9 & (uVar11 ^ uVar14)) + (uVar11 & uVar14) + iVar6;
  uVar5 = rotr_32(uVar12,0xe);
  uVar5 = rotr_32(uVar12 ^ uVar5,5);
  uVar5 = rotr_32(uVar12 ^ uVar5,6);
  W[5] = __bswap_32(data[7]);
  iVar6 = uVar5 + (uVar8 ^ uVar12 & (uVar10 ^ uVar8)) + 0xab1c5ed5 + W[5] + uVar13;
  uVar14 = iVar6 + uVar14;
  uVar5 = rotr_32(uVar15,9);
  uVar5 = rotr_32(uVar15 ^ uVar5,0xb);
  uVar5 = rotr_32(uVar15 ^ uVar5,2);
  uVar16 = uVar5 + (uVar15 & (uVar9 ^ uVar11)) + (uVar9 & uVar11) + iVar6;
  uVar5 = rotr_32(uVar14,0xe);
  uVar5 = rotr_32(uVar14 ^ uVar5,5);
  uVar5 = rotr_32(uVar14 ^ uVar5,6);
  W[6] = __bswap_32(data[8]);
  iVar6 = uVar5 + (uVar10 ^ uVar14 & (uVar12 ^ uVar10)) + 0xd807aa98 + W[6] + uVar8;
  uVar11 = iVar6 + uVar11;
  uVar5 = rotr_32(uVar16,9);
  uVar5 = rotr_32(uVar16 ^ uVar5,0xb);
  uVar5 = rotr_32(uVar16 ^ uVar5,2);
  uVar5 = uVar5 + (uVar16 & (uVar15 ^ uVar9)) + (uVar15 & uVar9) + iVar6;
  uVar7 = rotr_32(uVar11,0xe);
  uVar7 = rotr_32(uVar11 ^ uVar7,5);
  uVar7 = rotr_32(uVar11 ^ uVar7,6);
  W[7] = __bswap_32(data[9]);
  iVar6 = uVar7 + (uVar12 ^ uVar11 & (uVar14 ^ uVar12)) + 0x12835b01 + W[7] + uVar10;
  uVar9 = iVar6 + uVar9;
  uVar7 = rotr_32(uVar5,9);
  uVar7 = rotr_32(uVar5 ^ uVar7,0xb);
  uVar7 = rotr_32(uVar5 ^ uVar7,2);
  uVar13 = uVar7 + (uVar5 & (uVar16 ^ uVar15)) + (uVar16 & uVar15) + iVar6;
  uVar7 = rotr_32(uVar9,0xe);
  uVar7 = rotr_32(uVar9 ^ uVar7,5);
  uVar7 = rotr_32(uVar9 ^ uVar7,6);
  W[8] = __bswap_32(data[10]);
  iVar6 = uVar7 + (uVar14 ^ uVar9 & (uVar11 ^ uVar14)) + 0x243185be + W[8] + uVar12;
  uVar15 = iVar6 + uVar15;
  uVar7 = rotr_32(uVar13,9);
  uVar7 = rotr_32(uVar13 ^ uVar7,0xb);
  uVar7 = rotr_32(uVar13 ^ uVar7,2);
  uVar7 = uVar7 + (uVar13 & (uVar5 ^ uVar16)) + (uVar5 & uVar16) + iVar6;
  uVar8 = rotr_32(uVar15,0xe);
  uVar8 = rotr_32(uVar15 ^ uVar8,5);
  uVar8 = rotr_32(uVar15 ^ uVar8,6);
  W[9] = __bswap_32(data[0xb]);
  iVar6 = uVar8 + (uVar11 ^ uVar15 & (uVar9 ^ uVar11)) + 0x550c7dc3 + W[9] + uVar14;
  uVar16 = iVar6 + uVar16;
  uVar8 = rotr_32(uVar7,9);
  uVar8 = rotr_32(uVar7 ^ uVar8,0xb);
  uVar8 = rotr_32(uVar7 ^ uVar8,2);
  uVar10 = uVar8 + (uVar7 & (uVar13 ^ uVar5)) + (uVar13 & uVar5) + iVar6;
  uVar8 = rotr_32(uVar16,0xe);
  uVar8 = rotr_32(uVar16 ^ uVar8,5);
  uVar8 = rotr_32(uVar16 ^ uVar8,6);
  W[10] = __bswap_32(data[0xc]);
  iVar6 = uVar8 + (uVar9 ^ uVar16 & (uVar15 ^ uVar9)) + 0x72be5d74 + W[10] + uVar11;
  T[5] = iVar6 + uVar5;
  uVar5 = rotr_32(uVar10,9);
  uVar5 = rotr_32(uVar10 ^ uVar5,0xb);
  uVar5 = rotr_32(uVar10 ^ uVar5,2);
  T[1] = uVar5 + (uVar10 & (uVar7 ^ uVar13)) + (uVar7 & uVar13) + iVar6;
  uVar5 = rotr_32(T[5],0xe);
  uVar5 = rotr_32(T[5] ^ uVar5,5);
  uVar5 = rotr_32(T[5] ^ uVar5,6);
  W[0xb] = __bswap_32(data[0xd]);
  iVar6 = uVar5 + (uVar15 ^ T[5] & (uVar16 ^ uVar15)) + 0x80deb1fe + W[0xb] + uVar9;
  T[4] = iVar6 + uVar13;
  uVar5 = rotr_32(T[1],9);
  uVar5 = rotr_32(T[1] ^ uVar5,0xb);
  uVar5 = rotr_32(T[1] ^ uVar5,2);
  T[0] = uVar5 + (T[1] & (uVar10 ^ uVar7)) + (uVar10 & uVar7) + iVar6;
  uVar5 = rotr_32(T[4],0xe);
  uVar5 = rotr_32(T[4] ^ uVar5,5);
  uVar5 = rotr_32(T[4] ^ uVar5,6);
  W[0xc] = __bswap_32(data[0xe]);
  iVar6 = uVar5 + (uVar16 ^ T[4] & (T[5] ^ uVar16)) + 0x9bdc06a7 + W[0xc] + uVar15;
  T[3] = iVar6 + uVar7;
  uVar5 = rotr_32(T[0],9);
  uVar5 = rotr_32(T[0] ^ uVar5,0xb);
  uVar5 = rotr_32(T[0] ^ uVar5,2);
  j = uVar5 + (T[0] & (T[1] ^ uVar10)) + (T[1] & uVar10) + iVar6;
  uVar5 = rotr_32(T[3],0xe);
  uVar5 = rotr_32(T[3] ^ uVar5,5);
  uVar5 = rotr_32(T[3] ^ uVar5,6);
  W[0xd] = __bswap_32(data[0xf]);
  iVar6 = uVar5 + (T[5] ^ T[3] & (T[4] ^ T[5])) + 0xc19bf174 + W[0xd] + uVar16;
  T[2] = iVar6 + uVar10;
  uVar5 = rotr_32(j,9);
  uVar5 = rotr_32(j ^ uVar5,0xb);
  uVar5 = rotr_32(j ^ uVar5,2);
  uStack_78 = uVar5 + (j & (T[0] ^ T[1])) + (T[0] & T[1]) + iVar6;
  for (local_7c = 0x10; local_7c < 0x40; local_7c = local_7c + 0x10) {
    uVar5 = rotr_32(T[2],0xe);
    uVar5 = rotr_32(T[2] ^ uVar5,5);
    uVar7 = rotr_32(T[2] ^ uVar5,6);
    uVar5 = SHA256_K[local_7c];
    uVar11 = rotr_32(W[0xc],2);
    uVar11 = rotr_32(W[0xc] ^ uVar11,0x11);
    uVar8 = rotr_32(T[7],0xb);
    uVar8 = rotr_32(T[7] ^ uVar8,7);
    T[6] = (uVar11 ^ W[0xc] >> 10) + W[7] + (uVar8 ^ T[7] >> 3) + T[6];
    iVar6 = uVar7 + (T[4] ^ T[2] & (T[3] ^ T[4])) + uVar5 + T[6] + T[5];
    uVar7 = iVar6 + T[1];
    uVar5 = rotr_32(uStack_78,9);
    uVar5 = rotr_32(uStack_78 ^ uVar5,0xb);
    uVar5 = rotr_32(uStack_78 ^ uVar5,2);
    uVar17 = uVar5 + (uStack_78 & (j ^ T[0])) + (j & T[0]) + iVar6;
    uVar5 = rotr_32(uVar7,0xe);
    uVar5 = rotr_32(uVar7 ^ uVar5,5);
    uVar11 = rotr_32(uVar7 ^ uVar5,6);
    uVar5 = SHA256_K[local_7c + 1];
    uVar8 = rotr_32(W[0xd],2);
    uVar8 = rotr_32(W[0xd] ^ uVar8,0x11);
    uVar12 = rotr_32(W[0],0xb);
    uVar12 = rotr_32(W[0] ^ uVar12,7);
    T[7] = (uVar8 ^ W[0xd] >> 10) + W[8] + (uVar12 ^ W[0] >> 3) + T[7];
    iVar6 = uVar11 + (T[3] ^ uVar7 & (T[2] ^ T[3])) + uVar5 + T[7] + T[4];
    uVar9 = iVar6 + T[0];
    uVar5 = rotr_32(uVar17,9);
    uVar5 = rotr_32(uVar17 ^ uVar5,0xb);
    uVar5 = rotr_32(uVar17 ^ uVar5,2);
    uVar10 = uVar5 + (uVar17 & (uStack_78 ^ j)) + (uStack_78 & j) + iVar6;
    uVar5 = rotr_32(uVar9,0xe);
    uVar5 = rotr_32(uVar9 ^ uVar5,5);
    uVar11 = rotr_32(uVar9 ^ uVar5,6);
    uVar5 = SHA256_K[local_7c + 2];
    uVar8 = rotr_32(T[6],2);
    uVar8 = rotr_32(T[6] ^ uVar8,0x11);
    uVar12 = rotr_32(W[1],0xb);
    uVar12 = rotr_32(W[1] ^ uVar12,7);
    W[0] = (uVar8 ^ T[6] >> 10) + W[9] + (uVar12 ^ W[1] >> 3) + W[0];
    iVar6 = uVar11 + (T[2] ^ uVar9 & (uVar7 ^ T[2])) + uVar5 + W[0] + T[3];
    uVar11 = iVar6 + j;
    uVar5 = rotr_32(uVar10,9);
    uVar5 = rotr_32(uVar10 ^ uVar5,0xb);
    uVar5 = rotr_32(uVar10 ^ uVar5,2);
    uVar18 = uVar5 + (uVar10 & (uVar17 ^ uStack_78)) + (uVar17 & uStack_78) + iVar6;
    uVar5 = rotr_32(uVar11,0xe);
    uVar5 = rotr_32(uVar11 ^ uVar5,5);
    uVar8 = rotr_32(uVar11 ^ uVar5,6);
    uVar5 = SHA256_K[local_7c + 3];
    uVar12 = rotr_32(T[7],2);
    uVar12 = rotr_32(T[7] ^ uVar12,0x11);
    uVar15 = rotr_32(W[2],0xb);
    uVar15 = rotr_32(W[2] ^ uVar15,7);
    W[1] = (uVar12 ^ T[7] >> 10) + W[10] + (uVar15 ^ W[2] >> 3) + W[1];
    iVar6 = uVar8 + (uVar7 ^ uVar11 & (uVar9 ^ uVar7)) + uVar5 + W[1] + T[2];
    uVar13 = iVar6 + uStack_78;
    uVar5 = rotr_32(uVar18,9);
    uVar5 = rotr_32(uVar18 ^ uVar5,0xb);
    uVar5 = rotr_32(uVar18 ^ uVar5,2);
    uVar14 = uVar5 + (uVar18 & (uVar10 ^ uVar17)) + (uVar10 & uVar17) + iVar6;
    uVar5 = rotr_32(uVar13,0xe);
    uVar5 = rotr_32(uVar13 ^ uVar5,5);
    uVar8 = rotr_32(uVar13 ^ uVar5,6);
    uVar5 = SHA256_K[local_7c + 4];
    uVar12 = rotr_32(W[0],2);
    uVar12 = rotr_32(W[0] ^ uVar12,0x11);
    uVar15 = rotr_32(W[3],0xb);
    uVar15 = rotr_32(W[3] ^ uVar15,7);
    W[2] = (uVar12 ^ W[0] >> 10) + W[0xb] + (uVar15 ^ W[3] >> 3) + W[2];
    iVar6 = uVar8 + (uVar9 ^ uVar13 & (uVar11 ^ uVar9)) + uVar5 + W[2] + uVar7;
    uVar17 = iVar6 + uVar17;
    uVar5 = rotr_32(uVar14,9);
    uVar5 = rotr_32(uVar14 ^ uVar5,0xb);
    uVar5 = rotr_32(uVar14 ^ uVar5,2);
    uVar15 = uVar5 + (uVar14 & (uVar18 ^ uVar10)) + (uVar18 & uVar10) + iVar6;
    uVar5 = rotr_32(uVar17,0xe);
    uVar5 = rotr_32(uVar17 ^ uVar5,5);
    uVar7 = rotr_32(uVar17 ^ uVar5,6);
    uVar5 = SHA256_K[local_7c + 5];
    uVar8 = rotr_32(W[1],2);
    uVar8 = rotr_32(W[1] ^ uVar8,0x11);
    uVar12 = rotr_32(W[4],0xb);
    uVar12 = rotr_32(W[4] ^ uVar12,7);
    W[3] = (uVar8 ^ W[1] >> 10) + W[0xc] + (uVar12 ^ W[4] >> 3) + W[3];
    iVar6 = uVar7 + (uVar11 ^ uVar17 & (uVar13 ^ uVar11)) + uVar5 + W[3] + uVar9;
    uVar10 = iVar6 + uVar10;
    uVar5 = rotr_32(uVar15,9);
    uVar5 = rotr_32(uVar15 ^ uVar5,0xb);
    uVar5 = rotr_32(uVar15 ^ uVar5,2);
    uVar9 = uVar5 + (uVar15 & (uVar14 ^ uVar18)) + (uVar14 & uVar18) + iVar6;
    uVar5 = rotr_32(uVar10,0xe);
    uVar5 = rotr_32(uVar10 ^ uVar5,5);
    uVar7 = rotr_32(uVar10 ^ uVar5,6);
    uVar5 = SHA256_K[local_7c + 6];
    uVar8 = rotr_32(W[2],2);
    uVar8 = rotr_32(W[2] ^ uVar8,0x11);
    uVar12 = rotr_32(W[5],0xb);
    uVar12 = rotr_32(W[5] ^ uVar12,7);
    W[4] = (uVar8 ^ W[2] >> 10) + W[0xd] + (uVar12 ^ W[5] >> 3) + W[4];
    iVar6 = uVar7 + (uVar13 ^ uVar10 & (uVar17 ^ uVar13)) + uVar5 + W[4] + uVar11;
    uVar18 = iVar6 + uVar18;
    uVar5 = rotr_32(uVar9,9);
    uVar5 = rotr_32(uVar9 ^ uVar5,0xb);
    uVar5 = rotr_32(uVar9 ^ uVar5,2);
    uVar19 = uVar5 + (uVar9 & (uVar15 ^ uVar14)) + (uVar15 & uVar14) + iVar6;
    uVar5 = rotr_32(uVar18,0xe);
    uVar5 = rotr_32(uVar18 ^ uVar5,5);
    uVar7 = rotr_32(uVar18 ^ uVar5,6);
    uVar5 = SHA256_K[local_7c + 7];
    uVar11 = rotr_32(W[3],2);
    uVar11 = rotr_32(W[3] ^ uVar11,0x11);
    uVar8 = rotr_32(W[6],0xb);
    uVar8 = rotr_32(W[6] ^ uVar8,7);
    W[5] = (uVar11 ^ W[3] >> 10) + T[6] + (uVar8 ^ W[6] >> 3) + W[5];
    iVar6 = uVar7 + (uVar17 ^ uVar18 & (uVar10 ^ uVar17)) + uVar5 + W[5] + uVar13;
    uVar14 = iVar6 + uVar14;
    uVar5 = rotr_32(uVar19,9);
    uVar5 = rotr_32(uVar19 ^ uVar5,0xb);
    uVar5 = rotr_32(uVar19 ^ uVar5,2);
    uVar16 = uVar5 + (uVar19 & (uVar9 ^ uVar15)) + (uVar9 & uVar15) + iVar6;
    uVar5 = rotr_32(uVar14,0xe);
    uVar5 = rotr_32(uVar14 ^ uVar5,5);
    uVar7 = rotr_32(uVar14 ^ uVar5,6);
    uVar5 = SHA256_K[local_7c + 8];
    uVar11 = rotr_32(W[4],2);
    uVar11 = rotr_32(W[4] ^ uVar11,0x11);
    uVar8 = rotr_32(W[7],0xb);
    uVar8 = rotr_32(W[7] ^ uVar8,7);
    W[6] = (uVar11 ^ W[4] >> 10) + T[7] + (uVar8 ^ W[7] >> 3) + W[6];
    iVar6 = uVar7 + (uVar10 ^ uVar14 & (uVar18 ^ uVar10)) + uVar5 + W[6] + uVar17;
    uVar15 = iVar6 + uVar15;
    uVar5 = rotr_32(uVar16,9);
    uVar5 = rotr_32(uVar16 ^ uVar5,0xb);
    uVar5 = rotr_32(uVar16 ^ uVar5,2);
    uVar7 = uVar5 + (uVar16 & (uVar19 ^ uVar9)) + (uVar19 & uVar9) + iVar6;
    uVar5 = rotr_32(uVar15,0xe);
    uVar5 = rotr_32(uVar15 ^ uVar5,5);
    uVar11 = rotr_32(uVar15 ^ uVar5,6);
    uVar5 = SHA256_K[local_7c + 9];
    uVar8 = rotr_32(W[5],2);
    uVar8 = rotr_32(W[5] ^ uVar8,0x11);
    uVar12 = rotr_32(W[8],0xb);
    uVar12 = rotr_32(W[8] ^ uVar12,7);
    W[7] = (uVar8 ^ W[5] >> 10) + W[0] + (uVar12 ^ W[8] >> 3) + W[7];
    iVar6 = uVar11 + (uVar18 ^ uVar15 & (uVar14 ^ uVar18)) + uVar5 + W[7] + uVar10;
    uVar9 = iVar6 + uVar9;
    uVar5 = rotr_32(uVar7,9);
    uVar5 = rotr_32(uVar7 ^ uVar5,0xb);
    uVar5 = rotr_32(uVar7 ^ uVar5,2);
    uVar13 = uVar5 + (uVar7 & (uVar16 ^ uVar19)) + (uVar16 & uVar19) + iVar6;
    uVar5 = rotr_32(uVar9,0xe);
    uVar5 = rotr_32(uVar9 ^ uVar5,5);
    uVar11 = rotr_32(uVar9 ^ uVar5,6);
    uVar5 = SHA256_K[local_7c + 10];
    uVar8 = rotr_32(W[6],2);
    uVar8 = rotr_32(W[6] ^ uVar8,0x11);
    uVar12 = rotr_32(W[9],0xb);
    uVar12 = rotr_32(W[9] ^ uVar12,7);
    W[8] = (uVar8 ^ W[6] >> 10) + W[1] + (uVar12 ^ W[9] >> 3) + W[8];
    iVar6 = uVar11 + (uVar14 ^ uVar9 & (uVar15 ^ uVar14)) + uVar5 + W[8] + uVar18;
    uVar19 = iVar6 + uVar19;
    uVar5 = rotr_32(uVar13,9);
    uVar5 = rotr_32(uVar13 ^ uVar5,0xb);
    uVar5 = rotr_32(uVar13 ^ uVar5,2);
    uVar11 = uVar5 + (uVar13 & (uVar7 ^ uVar16)) + (uVar7 & uVar16) + iVar6;
    uVar5 = rotr_32(uVar19,0xe);
    uVar5 = rotr_32(uVar19 ^ uVar5,5);
    uVar8 = rotr_32(uVar19 ^ uVar5,6);
    uVar5 = SHA256_K[local_7c + 0xb];
    uVar12 = rotr_32(W[7],2);
    uVar12 = rotr_32(W[7] ^ uVar12,0x11);
    uVar17 = rotr_32(W[10],0xb);
    uVar17 = rotr_32(W[10] ^ uVar17,7);
    W[9] = (uVar12 ^ W[7] >> 10) + W[2] + (uVar17 ^ W[10] >> 3) + W[9];
    iVar6 = uVar8 + (uVar15 ^ uVar19 & (uVar9 ^ uVar15)) + uVar5 + W[9] + uVar14;
    uVar16 = iVar6 + uVar16;
    uVar5 = rotr_32(uVar11,9);
    uVar5 = rotr_32(uVar11 ^ uVar5,0xb);
    uVar5 = rotr_32(uVar11 ^ uVar5,2);
    uVar10 = uVar5 + (uVar11 & (uVar13 ^ uVar7)) + (uVar13 & uVar7) + iVar6;
    uVar5 = rotr_32(uVar16,0xe);
    uVar5 = rotr_32(uVar16 ^ uVar5,5);
    uVar8 = rotr_32(uVar16 ^ uVar5,6);
    uVar5 = SHA256_K[local_7c + 0xc];
    uVar12 = rotr_32(W[8],2);
    uVar12 = rotr_32(W[8] ^ uVar12,0x11);
    uVar17 = rotr_32(W[0xb],0xb);
    uVar17 = rotr_32(W[0xb] ^ uVar17,7);
    W[10] = (uVar12 ^ W[8] >> 10) + W[3] + (uVar17 ^ W[0xb] >> 3) + W[10];
    iVar6 = uVar8 + (uVar9 ^ uVar16 & (uVar19 ^ uVar9)) + uVar5 + W[10] + uVar15;
    T[5] = iVar6 + uVar7;
    uVar5 = rotr_32(uVar10,9);
    uVar5 = rotr_32(uVar10 ^ uVar5,0xb);
    uVar5 = rotr_32(uVar10 ^ uVar5,2);
    T[1] = uVar5 + (uVar10 & (uVar11 ^ uVar13)) + (uVar11 & uVar13) + iVar6;
    uVar5 = rotr_32(T[5],0xe);
    uVar5 = rotr_32(T[5] ^ uVar5,5);
    uVar7 = rotr_32(T[5] ^ uVar5,6);
    uVar5 = SHA256_K[local_7c + 0xd];
    uVar8 = rotr_32(W[9],2);
    uVar8 = rotr_32(W[9] ^ uVar8,0x11);
    uVar12 = rotr_32(W[0xc],0xb);
    uVar12 = rotr_32(W[0xc] ^ uVar12,7);
    W[0xb] = (uVar8 ^ W[9] >> 10) + W[4] + (uVar12 ^ W[0xc] >> 3) + W[0xb];
    iVar6 = uVar7 + (uVar19 ^ T[5] & (uVar16 ^ uVar19)) + uVar5 + W[0xb] + uVar9;
    T[4] = iVar6 + uVar13;
    uVar5 = rotr_32(T[1],9);
    uVar5 = rotr_32(T[1] ^ uVar5,0xb);
    uVar5 = rotr_32(T[1] ^ uVar5,2);
    T[0] = uVar5 + (T[1] & (uVar10 ^ uVar11)) + (uVar10 & uVar11) + iVar6;
    uVar5 = rotr_32(T[4],0xe);
    uVar5 = rotr_32(T[4] ^ uVar5,5);
    uVar7 = rotr_32(T[4] ^ uVar5,6);
    uVar5 = SHA256_K[local_7c + 0xe];
    uVar8 = rotr_32(W[10],2);
    uVar8 = rotr_32(W[10] ^ uVar8,0x11);
    uVar12 = rotr_32(W[0xd],0xb);
    uVar12 = rotr_32(W[0xd] ^ uVar12,7);
    W[0xc] = (uVar8 ^ W[10] >> 10) + W[5] + (uVar12 ^ W[0xd] >> 3) + W[0xc];
    iVar6 = uVar7 + (uVar16 ^ T[4] & (T[5] ^ uVar16)) + uVar5 + W[0xc] + uVar19;
    T[3] = iVar6 + uVar11;
    uVar5 = rotr_32(T[0],9);
    uVar5 = rotr_32(T[0] ^ uVar5,0xb);
    uVar5 = rotr_32(T[0] ^ uVar5,2);
    j = uVar5 + (T[0] & (T[1] ^ uVar10)) + (T[1] & uVar10) + iVar6;
    uVar5 = rotr_32(T[3],0xe);
    uVar5 = rotr_32(T[3] ^ uVar5,5);
    uVar7 = rotr_32(T[3] ^ uVar5,6);
    uVar5 = SHA256_K[local_7c + 0xf];
    uVar11 = rotr_32(W[0xb],2);
    uVar11 = rotr_32(W[0xb] ^ uVar11,0x11);
    uVar8 = rotr_32(T[6],0xb);
    uVar8 = rotr_32(T[6] ^ uVar8,7);
    W[0xd] = (uVar11 ^ W[0xb] >> 10) + W[6] + (uVar8 ^ T[6] >> 3) + W[0xd];
    iVar6 = uVar7 + (T[5] ^ T[3] & (T[4] ^ T[5])) + uVar5 + W[0xd] + uVar16;
    T[2] = iVar6 + uVar10;
    uVar5 = rotr_32(j,9);
    uVar5 = rotr_32(j ^ uVar5,0xb);
    uVar5 = rotr_32(j ^ uVar5,2);
    uStack_78 = uVar5 + (j & (T[0] ^ T[1])) + (T[0] & T[1]) + iVar6;
  }
  *state = uStack_78 + *state;
  state[1] = j + state[1];
  state[2] = T[0] + state[2];
  state[3] = T[1] + state[3];
  state[4] = T[2] + state[4];
  state[5] = T[3] + state[5];
  state[6] = T[4] + state[6];
  state[7] = T[5] + state[7];
  return;
}

Assistant:

static void
transform(uint32_t state[8], const uint32_t data[16])
{
	uint32_t W[16];
	uint32_t T[8];

	// Copy state[] to working vars.
	memcpy(T, state, sizeof(T));

	// The first 16 operations unrolled
	R0( 0); R0( 1); R0( 2); R0( 3);
	R0( 4); R0( 5); R0( 6); R0( 7);
	R0( 8); R0( 9); R0(10); R0(11);
	R0(12); R0(13); R0(14); R0(15);

	// The remaining 48 operations partially unrolled
	for (unsigned int j = 16; j < 64; j += 16) {
		R2( 0); R2( 1); R2( 2); R2( 3);
		R2( 4); R2( 5); R2( 6); R2( 7);
		R2( 8); R2( 9); R2(10); R2(11);
		R2(12); R2(13); R2(14); R2(15);
	}

	// Add the working vars back into state[].
	state[0] += a(0);
	state[1] += b(0);
	state[2] += c(0);
	state[3] += d(0);
	state[4] += e(0);
	state[5] += f(0);
	state[6] += g(0);
	state[7] += h(0);
}